

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O0

void encode_map(upb_encstate *e,upb_Message *msg,upb_MiniTableSubInternal *subs,
               upb_MiniTableField *f)

{
  upb_Map *map_00;
  _Bool _Var1;
  int iVar2;
  uint32_t uVar3;
  upb_MiniTable *m;
  size_t sVar4;
  undefined1 local_c8 [8];
  upb_MapEntry ent_1;
  upb_value val;
  upb_StringView key;
  intptr_t iter;
  upb_MapEntry ent;
  _upb_sortedmap sorted;
  upb_MiniTable *layout;
  upb_Map *map;
  upb_MiniTableField *f_local;
  upb_MiniTableSubInternal *subs_local;
  upb_Message *msg_local;
  upb_encstate *e_local;
  
  map_00 = *(upb_Map **)
            ((long)&msg->field_0 + (long)(int)(uint)f->offset_dont_copy_me__upb_internal_use_only);
  m = _upb_Encoder_GetSubMiniTable(subs,f);
  iVar2 = upb_MiniTable_FieldCount(m);
  if (iVar2 == 2) {
    if ((map_00 != (upb_Map *)0x0) && (sVar4 = upb_Map_Size(map_00), sVar4 != 0)) {
      if ((e->options & 1U) == 0) {
        key.size = 0xffffffffffffffff;
        while (_Var1 = upb_strtable_next2(&map_00->table,(upb_StringView *)&val,
                                          (upb_value *)&ent_1.v.str.size,(intptr_t *)&key.size),
              _Var1) {
          _upb_map_fromkey(_val,&ent_1.hasbits,(long)map_00->key_size);
          _upb_map_fromvalue((upb_value)ent_1.v.str.size,(void *)((long)&ent_1.k + 8),
                             (long)map_00->val_size);
          uVar3 = upb_MiniTableField_Number(f);
          encode_mapentry(e,uVar3,m,(upb_MapEntry *)local_c8);
        }
      }
      else {
        _upb_mapsorter_pushmap
                  (&e->sorter,
                   (uint)m->fields_dont_copy_me__upb_internal_use_only->
                         descriptortype_dont_copy_me__upb_internal_use_only,map_00,
                   (_upb_sortedmap *)((long)&ent.v + 0xc));
        while (_Var1 = _upb_sortedmap_next(&e->sorter,map_00,(_upb_sortedmap *)((long)&ent.v + 0xc),
                                           (upb_MapEntry *)&iter), _Var1) {
          uVar3 = upb_MiniTableField_Number(f);
          encode_mapentry(e,uVar3,m,(upb_MapEntry *)&iter);
        }
        _upb_mapsorter_popmap(&e->sorter,(_upb_sortedmap *)((long)&ent.v + 0xc));
      }
    }
    return;
  }
  __assert_fail("upb_MiniTable_FieldCount(layout) == 2",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/upb/wire/encode.c"
                ,0x1ba,
                "void encode_map(upb_encstate *, const upb_Message *, const upb_MiniTableSubInternal *, const upb_MiniTableField *)"
               );
}

Assistant:

static void encode_map(upb_encstate* e, const upb_Message* msg,
                       const upb_MiniTableSubInternal* subs,
                       const upb_MiniTableField* f) {
  const upb_Map* map = *UPB_PTR_AT(msg, f->UPB_PRIVATE(offset), const upb_Map*);
  const upb_MiniTable* layout = _upb_Encoder_GetSubMiniTable(subs, f);
  UPB_ASSERT(upb_MiniTable_FieldCount(layout) == 2);

  if (!map || !upb_Map_Size(map)) return;

  if (e->options & kUpb_EncodeOption_Deterministic) {
    _upb_sortedmap sorted;
    _upb_mapsorter_pushmap(
        &e->sorter, layout->UPB_PRIVATE(fields)[0].UPB_PRIVATE(descriptortype),
        map, &sorted);
    upb_MapEntry ent;
    while (_upb_sortedmap_next(&e->sorter, map, &sorted, &ent)) {
      encode_mapentry(e, upb_MiniTableField_Number(f), layout, &ent);
    }
    _upb_mapsorter_popmap(&e->sorter, &sorted);
  } else {
    intptr_t iter = UPB_STRTABLE_BEGIN;
    upb_StringView key;
    upb_value val;
    while (upb_strtable_next2(&map->table, &key, &val, &iter)) {
      upb_MapEntry ent;
      _upb_map_fromkey(key, &ent.k, map->key_size);
      _upb_map_fromvalue(val, &ent.v, map->val_size);
      encode_mapentry(e, upb_MiniTableField_Number(f), layout, &ent);
    }
  }
}